

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# componententity.cpp
# Opt level: O0

bool __thiscall
libcellml::ComponentEntity::replaceComponent
          (ComponentEntity *this,size_t index,ComponentPtr *newComponent)

{
  bool bVar1;
  ComponentEntityImpl *pCVar2;
  ComponentEntityImpl *pCVar3;
  element_type *this_00;
  ComponentImpl *this_01;
  __normal_iterator<std::shared_ptr<libcellml::Component>_*,_std::vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>_>
  local_80;
  __normal_iterator<std::shared_ptr<libcellml::Component>_*,_std::vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>_>
  local_78;
  const_iterator local_70;
  ParentedEntity local_58;
  undefined1 local_48 [8];
  ParentedEntityPtr parent;
  ComponentPtr oldComponent;
  bool status;
  ComponentPtr *newComponent_local;
  size_t index_local;
  ComponentEntity *this_local;
  
  component((ComponentEntity *)
            &parent.super___shared_ptr<libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount,(size_t)this);
  std::shared_ptr<libcellml::ParentedEntity>::shared_ptr
            ((shared_ptr<libcellml::ParentedEntity> *)local_48,(nullptr_t)0x0);
  bVar1 = std::operator!=((shared_ptr<libcellml::Component> *)
                          &parent.
                           super___shared_ptr<libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount,(nullptr_t)0x0);
  if (bVar1) {
    std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)&parent.super___shared_ptr<libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount);
    ParentedEntity::parent(&local_58);
    std::shared_ptr<libcellml::ParentedEntity>::operator=
              ((shared_ptr<libcellml::ParentedEntity> *)local_48,
               (shared_ptr<libcellml::ParentedEntity> *)&local_58);
    std::shared_ptr<libcellml::ParentedEntity>::~shared_ptr
              ((shared_ptr<libcellml::ParentedEntity> *)&local_58);
  }
  bVar1 = removeComponent(this,index);
  if (bVar1) {
    pCVar2 = pFunc(this);
    pCVar3 = pFunc(this);
    local_80._M_current =
         (shared_ptr<libcellml::Component> *)
         std::
         vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
         ::begin(&pCVar3->mComponents);
    local_78 = __gnu_cxx::
               __normal_iterator<std::shared_ptr<libcellml::Component>_*,_std::vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>_>
               ::operator+(&local_80,index);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<libcellml::Component>const*,std::vector<std::shared_ptr<libcellml::Component>,std::allocator<std::shared_ptr<libcellml::Component>>>>
    ::__normal_iterator<std::shared_ptr<libcellml::Component>*>
              ((__normal_iterator<std::shared_ptr<libcellml::Component>const*,std::vector<std::shared_ptr<libcellml::Component>,std::allocator<std::shared_ptr<libcellml::Component>>>>
                *)&local_70,&local_78);
    std::
    vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
    ::insert(&pCVar2->mComponents,local_70,newComponent);
    this_00 = std::
              __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)newComponent);
    this_01 = Component::pFunc(this_00);
    ParentedEntity::ParentedEntityImpl::setParent
              ((ParentedEntityImpl *)this_01,(ParentedEntityPtr *)local_48);
  }
  std::shared_ptr<libcellml::ParentedEntity>::~shared_ptr
            ((shared_ptr<libcellml::ParentedEntity> *)local_48);
  std::shared_ptr<libcellml::Component>::~shared_ptr
            ((shared_ptr<libcellml::Component> *)
             &parent.super___shared_ptr<libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return bVar1;
}

Assistant:

bool ComponentEntity::replaceComponent(size_t index, const ComponentPtr &newComponent)
{
    bool status = false;
    auto oldComponent = component(index);
    ParentedEntityPtr parent = nullptr;
    if (oldComponent != nullptr) {
        parent = oldComponent->parent();
    }

    if (removeComponent(index)) {
        pFunc()->mComponents.insert(pFunc()->mComponents.begin() + ptrdiff_t(index), newComponent);
        newComponent->pFunc()->setParent(parent);
        status = true;
    }

    return status;
}